

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GdlObject.h
# Opt level: O1

void __thiscall GdlObject::GdlObject(GdlObject *this)

{
  long *local_78;
  long local_70;
  long local_68 [2];
  undefined8 local_58;
  long *local_50 [2];
  long local_40 [2];
  
  (this->m_lnf).m_nLinePre = -1;
  (this->m_lnf).m_nLineOrig = -1;
  (this->m_lnf).m_staFile._M_dataplus._M_p = (pointer)&(this->m_lnf).m_staFile.field_2;
  (this->m_lnf).m_staFile._M_string_length = 0;
  (this->m_lnf).m_staFile.field_2._M_local_buf[0] = '\0';
  local_78 = local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"");
  local_58 = 0;
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char*>((string *)local_50,local_78,local_70 + (long)local_78);
  (this->m_lnf).m_nLinePre = (undefined4)local_58;
  (this->m_lnf).m_nLineOrig = local_58._4_4_;
  std::__cxx11::string::_M_assign((string *)&(this->m_lnf).m_staFile);
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  if (local_78 != local_68) {
    operator_delete(local_78,local_68[0] + 1);
  }
  return;
}

Assistant:

GdlObject()
	{
		m_lnf = GrpLineAndFile(0, 0, "");
	}